

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plain_fkhash_nlm.hpp
# Opt level: O0

value_type_conflict7 * __thiscall
poplar::plain_fkhash_nlm<int>::append(plain_fkhash_nlm<int> *this,char_range *key)

{
  pointer dst;
  char_range *in_RSI;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_RDI;
  value_type_conflict7 *ret;
  pointer ptr;
  uint64_t length;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *__args;
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  *in_stack_ffffffffffffffc0;
  size_t in_stack_ffffffffffffffc8;
  unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> local_20;
  uint64_t local_18;
  char_range *local_10;
  
  local_10 = in_RSI;
  local_18 = char_range::length(in_RSI);
  __args = &local_20;
  std::make_unique<unsigned_char[]>(in_stack_ffffffffffffffc8);
  std::
  vector<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>,std::allocator<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>>
  ::emplace_back<std::unique_ptr<unsigned_char[],std::default_delete<unsigned_char[]>>>
            (in_stack_ffffffffffffffc0,__args);
  std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::~unique_ptr
            ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)
             in_stack_ffffffffffffffc0);
  in_RDI[1].
  super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)((long)&((in_RDI[1].
                          super__Vector_base<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                        super___uniq_ptr_impl<unsigned_char,_std::default_delete<unsigned_char[]>_>.
                        _M_t + local_18 + 4);
  std::
  vector<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>,_std::allocator<std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>_>_>
  ::back(in_RDI);
  dst = std::unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_>::get
                  ((unique_ptr<unsigned_char[],_std::default_delete<unsigned_char[]>_> *)in_RDI);
  copy_bytes(dst,local_10->begin,local_18);
  *(value_type_conflict7 *)(dst + local_18) = 0;
  return (value_type_conflict7 *)(dst + local_18);
}

Assistant:

value_type* append(const char_range& key) {
        uint64_t length = key.length();
        ptrs_.emplace_back(std::make_unique<uint8_t[]>(length + sizeof(value_type)));
        label_bytes_ += length + sizeof(value_type);

        auto ptr = ptrs_.back().get();
        copy_bytes(ptr, key.begin, length);

#ifdef POPLAR_EXTRA_STATS
        max_length_ = std::max(max_length_, length);
        sum_length_ += length;
#endif

        auto ret = reinterpret_cast<value_type*>(ptr + length);
        *ret = static_cast<value_type>(0);

        return ret;
    }